

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O3

void EMIT_OP_RPTR_REG(CodeGenGenericContext *ctx,x86Command op,x86Size size,x86Reg index,
                     int multiplier,x86Reg base,uint shift,x86XmmReg reg2)

{
  x86Instruction *pxVar1;
  x86Argument arg_00;
  uint uVar2;
  x86Reg xVar3;
  int iVar4;
  x86Reg xVar5;
  ulong uVar6;
  x86Argument arg;
  x86Reg local_7c;
  int local_78;
  x86Reg local_74;
  x86Argument local_70;
  x86Argument local_50;
  
  uVar6 = (ulong)reg2;
  local_7c = base;
  local_78 = multiplier;
  local_74 = index;
  CodeGenGenericContext::RedirectAddressComputation(ctx,&local_74,&local_78,&local_7c,&shift);
  xVar5 = local_74;
  iVar4 = local_78;
  xVar3 = local_7c;
  uVar2 = shift;
  if (ctx->xmmReg[uVar6].type == argXmmReg) {
    uVar6 = (ulong)ctx->xmmReg[uVar6].field_1.reg;
  }
  local_70.type = argPtr;
  local_70.ptrBase = local_7c;
  local_70.ptrIndex = local_74;
  local_70.ptrMult = local_78;
  local_70.ptrNum = shift;
  ctx->genRegRead[local_7c] = true;
  ctx->genRegRead[local_74] = true;
  ctx->xmmRegRead[uVar6] = true;
  local_70.field_1.ptrSize = size;
  if ((op & ~o_mov) == o_movss) {
    if (local_7c != rESP) {
      arg_00._4_4_ = local_70._4_4_;
      arg_00.type = 4;
      arg_00.field_1.imm64Arg._4_4_ = local_70.field_1.imm64Arg._4_4_;
      arg_00.field_1.ptrSize = size;
      arg_00.ptrIndex = local_74;
      arg_00.ptrBase = local_7c;
      arg_00.ptrNum = shift;
      arg_00.ptrMult = local_78;
      CodeGenGenericContext::InvalidateAddressValue(ctx,arg_00);
      CodeGenGenericContext::MemKillDeadStore(ctx,&local_70);
      local_50.type = argXmmReg;
      local_50.ptrBase = rNONE;
      local_50.ptrIndex = rNONE;
      local_50.ptrMult = 0;
      local_50.ptrNum = 0;
      local_50.field_1.reg = (x86Reg)uVar6;
      CodeGenGenericContext::MemWrite(ctx,&local_70,&local_50);
    }
    pxVar1 = ctx->x86Op;
    pxVar1->name = op;
    (pxVar1->argA).type = argPtr;
    (pxVar1->argA).field_1.ptrSize = size;
    pxVar1 = ctx->x86Op;
    (pxVar1->argA).ptrIndex = xVar5;
    (pxVar1->argA).ptrMult = iVar4;
    (pxVar1->argA).ptrBase = xVar3;
    (pxVar1->argA).ptrNum = uVar2;
    (pxVar1->argB).type = argXmmReg;
    (pxVar1->argB).field_1.reg = (x86Reg)uVar6;
    ctx->x86Op = ctx->x86Op + 1;
    return;
  }
  __assert_fail("!\"unknown instruction\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                ,0x74d,
                "void EMIT_OP_RPTR_REG(CodeGenGenericContext &, x86Command, x86Size, x86Reg, int, x86Reg, unsigned int, x86XmmReg)"
               );
}

Assistant:

void EMIT_OP_RPTR_REG(CodeGenGenericContext &ctx, x86Command op, x86Size size, x86Reg index, int multiplier, x86Reg base, unsigned shift, x86XmmReg reg2)
{
#ifdef NULLC_OPTIMIZE_X86
	ctx.RedirectAddressComputation(index, multiplier, base, shift);

	reg2 = ctx.RedirectRegister(reg2);

	x86Argument arg = x86Argument(size, index, multiplier, base, shift);

	// Register reads
	ctx.ReadRegister(base);
	ctx.ReadRegister(index);
	ctx.ReadRegister(reg2);

	switch(op)
	{
	case o_movss:
	case o_movsd:
		// No tracking for stack
		if(base == rESP)
			break;

		ctx.InvalidateAddressValue(arg);

		ctx.MemKillDeadStore(arg);

		// Track target memory value
		ctx.MemWrite(arg, x86Argument(reg2));
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argPtr;
	ctx.x86Op->argA.ptrSize = size;
	ctx.x86Op->argA.ptrIndex = index;
	ctx.x86Op->argA.ptrMult = multiplier;
	ctx.x86Op->argA.ptrBase = base;
	ctx.x86Op->argA.ptrNum = shift;
	ctx.x86Op->argB.type = x86Argument::argXmmReg;
	ctx.x86Op->argB.xmmArg = reg2;
	ctx.x86Op++;
}